

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Bool IsPreDescendant(Node *node)

{
  do {
    node = node->parent;
    if (node == (Node *)0x0) {
      return no;
    }
  } while ((node->tag == (Dict *)0x0) || (node->tag->parser != prvTidyParsePre));
  return yes;
}

Assistant:

static Bool IsPreDescendant(Node* node)
{
    Node *parent = node->parent;

    while (parent)
    {
        if (parent->tag && parent->tag->parser == TY_(ParsePre))
            return yes;

        parent = parent->parent;
    }

    return no;
}